

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O0

MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
* wasm::WATParser::anon_unknown_22::assertion
            (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
             *__return_storage_ptr__,Lexer *in)

{
  MaybeResult *pMVar1;
  bool bVar2;
  AssertReturn *__t;
  AssertAction *pAVar3;
  AssertModule *__t_00;
  variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
  *u;
  Err local_7a8;
  Err *local_788;
  Err *err_4;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  _val_4;
  MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  a_4;
  Err local_5d8;
  Err *local_5b8;
  Err *err_3;
  MaybeResult<wasm::WATParser::AssertModule> _val_3;
  MaybeResult<wasm::WATParser::AssertModule> a_3;
  Err local_4a8;
  Err *local_488;
  Err *err_2;
  MaybeResult<wasm::WATParser::AssertAction> _val_2;
  MaybeResult<wasm::WATParser::AssertAction> a_2;
  Err local_308;
  Err *local_2e8;
  Err *err_1;
  MaybeResult<wasm::WATParser::AssertAction> _val_1;
  MaybeResult<wasm::WATParser::AssertAction> a_1;
  Err local_160;
  Err *local_140;
  Err *err;
  MaybeResult<wasm::WATParser::AssertReturn> _val;
  undefined1 local_a0 [8];
  MaybeResult<wasm::WATParser::AssertReturn> a;
  Lexer *in_local;
  
  a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._128_8_ = in;
  assertReturn((MaybeResult<wasm::WATParser::AssertReturn> *)local_a0,in);
  bVar2 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_a0);
  if (bVar2) {
    MaybeResult<wasm::WATParser::AssertReturn>::MaybeResult
              ((MaybeResult<wasm::WATParser::AssertReturn> *)&err,
               (MaybeResult<wasm::WATParser::AssertReturn> *)local_a0);
    local_140 = MaybeResult<wasm::WATParser::AssertReturn>::getErr
                          ((MaybeResult<wasm::WATParser::AssertReturn> *)&err);
    bVar2 = local_140 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_160,local_140);
      MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
      ::MaybeResult(__return_storage_ptr__,&local_160);
      wasm::Err::~Err(&local_160);
    }
    MaybeResult<wasm::WATParser::AssertReturn>::~MaybeResult
              ((MaybeResult<wasm::WATParser::AssertReturn> *)&err);
    if (!bVar2) {
      __t = MaybeResult<wasm::WATParser::AssertReturn>::operator*
                      ((MaybeResult<wasm::WATParser::AssertReturn> *)local_a0);
      std::
      variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
      ::variant<wasm::WATParser::AssertReturn&,void,void,wasm::WATParser::AssertReturn,void>
                ((variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                  *)((long)&a_1.val.
                            super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                    + 0x70),__t);
      MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
      ::
      MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                ((MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                  *)__return_storage_ptr__,
                 (variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                  *)((long)&a_1.val.
                            super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                    + 0x70));
      std::
      variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~variant((variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                  *)((long)&a_1.val.
                            super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                    + 0x70));
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  MaybeResult<wasm::WATParser::AssertReturn>::~MaybeResult
            ((MaybeResult<wasm::WATParser::AssertReturn> *)local_a0);
  if (!bVar2) {
    pMVar1 = (MaybeResult *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> +
             0x70);
    assertException((MaybeResult<wasm::WATParser::AssertAction> *)pMVar1,
                    (Lexer *)a.val.
                             super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                             ._128_8_);
    bVar2 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
    if (bVar2) {
      MaybeResult<wasm::WATParser::AssertAction>::MaybeResult
                ((MaybeResult<wasm::WATParser::AssertAction> *)&err_1,
                 (MaybeResult<wasm::WATParser::AssertAction> *)
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                 + 0x70));
      local_2e8 = MaybeResult<wasm::WATParser::AssertAction>::getErr
                            ((MaybeResult<wasm::WATParser::AssertAction> *)&err_1);
      bVar2 = local_2e8 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_308,local_2e8);
        MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
        ::MaybeResult(__return_storage_ptr__,&local_308);
        wasm::Err::~Err(&local_308);
      }
      MaybeResult<wasm::WATParser::AssertAction>::~MaybeResult
                ((MaybeResult<wasm::WATParser::AssertAction> *)&err_1);
      if (!bVar2) {
        pAVar3 = MaybeResult<wasm::WATParser::AssertAction>::operator*
                           ((MaybeResult<wasm::WATParser::AssertAction> *)
                            ((long)&_val_1.val.
                                    super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                            + 0x70));
        std::
        variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
        ::variant<wasm::WATParser::AssertAction&,void,void,wasm::WATParser::AssertAction,void>
                  ((variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                    *)((long)&a_2.val.
                              super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                      + 0x70),pAVar3);
        MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
        ::
        MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                  ((MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                    *)__return_storage_ptr__,
                   (variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                    *)((long)&a_2.val.
                              super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                      + 0x70));
        std::
        variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~variant((variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                    *)((long)&a_2.val.
                              super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                      + 0x70));
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    MaybeResult<wasm::WATParser::AssertAction>::~MaybeResult
              ((MaybeResult<wasm::WATParser::AssertAction> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                       .super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
               + 0x70));
    if (!bVar2) {
      pMVar1 = (MaybeResult *)
               ((long)&_val_2.val.
                       super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                       .super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
               + 0x70);
      assertAction((MaybeResult<wasm::WATParser::AssertAction> *)pMVar1,
                   (Lexer *)a.val.
                            super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                            ._128_8_);
      bVar2 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
      if (bVar2) {
        MaybeResult<wasm::WATParser::AssertAction>::MaybeResult
                  ((MaybeResult<wasm::WATParser::AssertAction> *)&err_2,
                   (MaybeResult<wasm::WATParser::AssertAction> *)
                   ((long)&_val_2.val.
                           super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                   + 0x70));
        local_488 = MaybeResult<wasm::WATParser::AssertAction>::getErr
                              ((MaybeResult<wasm::WATParser::AssertAction> *)&err_2);
        bVar2 = local_488 != (Err *)0x0;
        if (bVar2) {
          wasm::Err::Err(&local_4a8,local_488);
          MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
          ::MaybeResult(__return_storage_ptr__,&local_4a8);
          wasm::Err::~Err(&local_4a8);
        }
        MaybeResult<wasm::WATParser::AssertAction>::~MaybeResult
                  ((MaybeResult<wasm::WATParser::AssertAction> *)&err_2);
        if (!bVar2) {
          pAVar3 = MaybeResult<wasm::WATParser::AssertAction>::operator*
                             ((MaybeResult<wasm::WATParser::AssertAction> *)
                              ((long)&_val_2.val.
                                      super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                              + 0x70));
          std::
          variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
          ::variant<wasm::WATParser::AssertAction&,void,void,wasm::WATParser::AssertAction,void>
                    ((variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                      *)((long)&a_3.val.
                                super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                        + 0x38),pAVar3);
          MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
          ::
          MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                    ((MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                      *)__return_storage_ptr__,
                     (variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                      *)((long)&a_3.val.
                                super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                        + 0x38));
          std::
          variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          ::~variant((variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                      *)((long)&a_3.val.
                                super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                        + 0x38));
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
      }
      MaybeResult<wasm::WATParser::AssertAction>::~MaybeResult
                ((MaybeResult<wasm::WATParser::AssertAction> *)
                 ((long)&_val_2.val.
                         super__Variant_base<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                 + 0x70));
      if (!bVar2) {
        pMVar1 = (MaybeResult *)
                 ((long)&_val_3.val.
                         super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                 + 0x38);
        assertModule((MaybeResult<wasm::WATParser::AssertModule> *)pMVar1,
                     (Lexer *)a.val.
                              super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              ._128_8_);
        bVar2 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
        if (bVar2) {
          MaybeResult<wasm::WATParser::AssertModule>::MaybeResult
                    ((MaybeResult<wasm::WATParser::AssertModule> *)&err_3,
                     (MaybeResult<wasm::WATParser::AssertModule> *)
                     ((long)&_val_3.val.
                             super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                     + 0x38));
          local_5b8 = MaybeResult<wasm::WATParser::AssertModule>::getErr
                                ((MaybeResult<wasm::WATParser::AssertModule> *)&err_3);
          bVar2 = local_5b8 != (Err *)0x0;
          if (bVar2) {
            wasm::Err::Err(&local_5d8,local_5b8);
            MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
            ::MaybeResult(__return_storage_ptr__,&local_5d8);
            wasm::Err::~Err(&local_5d8);
          }
          MaybeResult<wasm::WATParser::AssertModule>::~MaybeResult
                    ((MaybeResult<wasm::WATParser::AssertModule> *)&err_3);
          if (!bVar2) {
            __t_00 = MaybeResult<wasm::WATParser::AssertModule>::operator*
                               ((MaybeResult<wasm::WATParser::AssertModule> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                                + 0x38));
            std::
            variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
            ::variant<wasm::WATParser::AssertModule&,void,void,wasm::WATParser::AssertModule,void>
                      ((variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                        *)((long)&a_4.val.
                                  super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          + 0x88),__t_00);
            MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
            ::
            MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                      ((MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                        *)__return_storage_ptr__,
                       (variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                        *)((long)&a_4.val.
                                  super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          + 0x88));
            std::
            variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
            ::~variant((variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                        *)((long)&a_4.val.
                                  super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                          + 0x88));
            bVar2 = true;
          }
        }
        else {
          bVar2 = false;
        }
        MaybeResult<wasm::WATParser::AssertModule>::~MaybeResult
                  ((MaybeResult<wasm::WATParser::AssertModule> *)
                   ((long)&_val_3.val.
                           super__Variant_base<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                   + 0x38));
        if (!bVar2) {
          pMVar1 = (MaybeResult *)
                   ((long)&_val_4.val.
                           super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   + 0x88);
          assertTrap((MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                      *)pMVar1,
                     (Lexer *)a.val.
                              super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                              ._128_8_);
          bVar2 = wasm::MaybeResult::operator_cast_to_bool(pMVar1);
          if (bVar2) {
            MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
            ::MaybeResult((MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                           *)&err_4,
                          (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                           *)((long)&_val_4.val.
                                     super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                             + 0x88));
            local_788 = MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                        ::getErr((MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                                  *)&err_4);
            bVar2 = local_788 != (Err *)0x0;
            if (bVar2) {
              wasm::Err::Err(&local_7a8,local_788);
              MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
              ::MaybeResult(__return_storage_ptr__,&local_7a8);
              wasm::Err::~Err(&local_7a8);
            }
            MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
            ::~MaybeResult((MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                            *)&err_4);
            if (!bVar2) {
              u = MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                  ::operator*((MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                               *)((long)&_val_4.val.
                                         super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                         .
                                         super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                 + 0x88));
              MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
              ::
              MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>&>
                        ((MaybeResult<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                          *)__return_storage_ptr__,u);
              bVar2 = true;
            }
          }
          else {
            bVar2 = false;
          }
          MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
          ::~MaybeResult((MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                          *)((long)&_val_4.val.
                                    super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                            + 0x88));
          if (!bVar2) {
            MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
            ::MaybeResult(__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<Assertion> assertion(Lexer& in) {
  if (auto a = assertReturn(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertException(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertAction(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertModule(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertTrap(in)) {
    CHECK_ERR(a);
    return *a;
  }
  return {};
}